

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r7pfr.cpp
# Opt level: O0

void compute_coeffs(double *data,double *coeffs)

{
  double *coeffs_local;
  double *data_local;
  
  *coeffs = -data[0xf];
  coeffs[1] = -data[0x10];
  coeffs[2] = -data[0xe];
  coeffs[3] = data[1] - data[0x11];
  coeffs[4] = -data[0x12];
  coeffs[5] = data[2];
  coeffs[6] = -data[0x13];
  coeffs[7] = *data;
  coeffs[8] = data[3];
  coeffs[9] = data[4] - data[0x14];
  coeffs[10] = data[5];
  coeffs[0xb] = data[6];
  coeffs[0xc] = data[8];
  coeffs[0xd] = data[9] - data[0x11];
  coeffs[0xe] = data[7];
  coeffs[0xf] = data[10];
  coeffs[0x10] = data[0xb];
  coeffs[0x11] = data[0xc] - data[0x14];
  coeffs[0x12] = data[0xd];
  coeffs[0x13] = 1.0;
  coeffs[0x14] = data[0x16];
  coeffs[0x15] = data[0x17];
  coeffs[0x16] = data[0x15];
  coeffs[0x17] = data[0x18];
  coeffs[0x18] = data[0x19];
  coeffs[0x19] = data[0x1a];
  coeffs[0x1a] = data[0x1b];
  coeffs[0x1b] = data[0x1d];
  coeffs[0x1c] = data[0x1e];
  coeffs[0x1d] = data[0x1c];
  coeffs[0x1e] = data[0x1f];
  coeffs[0x1f] = data[0x20];
  coeffs[0x20] = data[0x21];
  coeffs[0x21] = data[0x22];
  return;
}

Assistant:

static void compute_coeffs(const double data[35], double coeffs[34])
{
  coeffs[0] = -data[15];
  coeffs[1] = -data[16];
  coeffs[2] = -data[14];
  coeffs[3] = data[1] - data[17];
  coeffs[4] = -data[18];
  coeffs[5] = data[2];
  coeffs[6] = -data[19];
  coeffs[7] = data[0];
  coeffs[8] = data[3];
  coeffs[9] = data[4] - data[20];
  coeffs[10] = data[5];
  coeffs[11] = data[6];
  coeffs[12] = data[8];
  coeffs[13] = data[9] - data[17];
  coeffs[14] = data[7];
  coeffs[15] = data[10];
  coeffs[16] = data[11];
  coeffs[17] = data[12] - data[20];
  coeffs[18] = data[13];
  coeffs[19] = 1.0;
  coeffs[20] = data[22];
  coeffs[21] = data[23];
  coeffs[22] = data[21];
  coeffs[23] = data[24];
  coeffs[24] = data[25];
  coeffs[25] = data[26];
  coeffs[26] = data[27];
  coeffs[27] = data[29];
  coeffs[28] = data[30];
  coeffs[29] = data[28];
  coeffs[30] = data[31];
  coeffs[31] = data[32];
  coeffs[32] = data[33];
  coeffs[33] = data[34];
}